

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O3

void __thiscall re2c::If::~If(If *this)

{
  Binary *this_00;
  
  if (this->type == LINEAR) {
    this_00 = (Binary *)(this->info).linear;
    if (this_00 != (Binary *)0x0) {
      Linear::~Linear((Linear *)this_00);
    }
  }
  else {
    if (this->type != BINARY) {
      return;
    }
    this_00 = (this->info).binary;
    if (this_00 != (Binary *)0x0) {
      Binary::~Binary(this_00);
    }
  }
  operator_delete(this_00,0x18);
  return;
}

Assistant:

If::~If ()
{
	switch (type)
	{
		case BINARY:
			delete info.binary;
			break;
		case LINEAR:
			delete info.linear;
			break;
	}
}